

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O0

user_options * user_options::get(user_options *__return_storage_ptr__,int argc,tchar **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  endian *peVar2;
  uint *puVar3;
  allocator local_41;
  string local_40 [32];
  tchar **local_20;
  tchar **argv_local;
  user_options *puStack_10;
  int argc_local;
  user_options *result;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  puStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"pstore prime number generator\n",&local_41);
  pstore::command_line::parse_command_line_options(argc,argv,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  user_options(__return_storage_ptr__);
  pbVar1 = pstore::command_line::
           opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
           ::get((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                  *)(anonymous_namespace)::output_opt_abi_cxx11_);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)pbVar1);
  peVar2 = pstore::command_line::opt<endian,_pstore::command_line::parser<endian,_void>_>::get
                     ((opt<endian,_pstore::command_line::parser<endian,_void>_> *)
                      (anonymous_namespace)::endian_opt);
  __return_storage_ptr__->endianness = *peVar2;
  puVar3 = pstore::command_line::
           opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_>::get
                     ((opt<unsigned_int,_pstore::command_line::parser<unsigned_int,_void>_> *)
                      (anonymous_namespace)::maximum_opt);
  __return_storage_ptr__->maximum = (ulong)*puVar3;
  return __return_storage_ptr__;
}

Assistant:

user_options user_options::get (int argc, tchar * argv[]) {
    parse_command_line_options (argc, argv, "pstore prime number generator\n");

    user_options result;
    result.output = output_opt.get ();
    result.endianness = endian_opt.get ();
    result.maximum = maximum_opt.get ();
    return result;
}